

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O1

EC_T_DWORD
CoeReadObjectDictionary
          (EC_T_DWORD dwInstanceID,CAtEmLogging *poLog,EC_T_INT nVerbosePrinting,
          EC_T_BOOL *pbStopReading,EC_T_DWORD dwClientId,EC_T_DWORD dwNodeId,
          EC_T_BOOL bPerformUpload,EC_T_DWORD dwTimeout)

{
  byte bVar1;
  ushort uVar2;
  EC_T_DWORD EVar3;
  ushort uVar4;
  uint uVar5;
  void *__s;
  undefined8 *__ptr;
  undefined8 *__ptr_00;
  EC_T_MBXTFER *pMbxTfer;
  EC_T_DWORD *pEVar6;
  EC_T_MBXTFER *pMbxTfer_00;
  size_t sVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ushort uVar13;
  int iVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  byte local_384;
  void *local_378;
  EC_T_DWORD local_360;
  ulong local_358;
  EC_T_DWORD local_330;
  int local_32c;
  EC_T_CHAR szMaxValue [10];
  EC_T_CHAR szMinValue [10];
  EC_T_CHAR szDefaultValue [10];
  EC_T_CHAR szUnitType [10];
  EC_T_MBXTFER_DESC MbxTferDesc;
  EC_T_CHAR szPdoMapInfo [50];
  EC_T_CHAR szDescription [50];
  EC_T_CHAR szObName [100];
  
  if (dwTimeout == 0 || (pbStopReading == (EC_T_BOOL *)0x0 || poLog == (CAtEmLogging *)0x0)) {
    local_360 = 0x9811000b;
    __s = (void *)0x0;
    __ptr = (undefined8 *)0x0;
    __ptr_00 = (undefined8 *)0x0;
    EVar3 = local_360;
  }
  else {
    __s = malloc(0x1200);
    __ptr = (undefined8 *)malloc(100);
    __ptr_00 = (undefined8 *)malloc(100);
    local_360 = 0x9811000a;
    EVar3 = local_360;
    local_360 = 0x9811000a;
    if (__ptr_00 != (undefined8 *)0x0 && (__ptr != (undefined8 *)0x0 && __s != (void *)0x0)) {
      memset(__s,0,0x1200);
      *__ptr = 0;
      __ptr[1] = 0;
      __ptr[2] = 0;
      __ptr[3] = 0;
      __ptr[4] = 0;
      __ptr[5] = 0;
      __ptr[6] = 0;
      __ptr[7] = 0;
      __ptr[8] = 0;
      __ptr[9] = 0;
      __ptr[10] = 0;
      __ptr[0xb] = 0;
      *(undefined4 *)(__ptr + 0xc) = 0;
      *__ptr_00 = 0;
      __ptr_00[1] = 0;
      __ptr_00[2] = 0;
      __ptr_00[3] = 0;
      __ptr_00[4] = 0;
      __ptr_00[5] = 0;
      __ptr_00[6] = 0;
      __ptr_00[7] = 0;
      __ptr_00[8] = 0;
      __ptr_00[9] = 0;
      __ptr_00[10] = 0;
      __ptr_00[0xb] = 0;
      *(undefined4 *)(__ptr_00 + 0xc) = 0;
      pMbxTfer = (EC_T_MBXTFER *)emMbxTferCreate(dwInstanceID);
      if (pMbxTfer != (EC_T_MBXTFER *)0x0) {
        pEVar6 = (EC_T_DWORD *)emMbxTferCreate(dwInstanceID);
        if (pEVar6 == (EC_T_DWORD *)0x0) {
          pEVar6 = (EC_T_DWORD *)0x0;
        }
        else {
          pMbxTfer_00 = (EC_T_MBXTFER *)emMbxTferCreate(dwInstanceID);
          if (pMbxTfer_00 != (EC_T_MBXTFER *)0x0) {
            pMbxTfer->dwClntId = dwClientId;
            pMbxTfer->dwTferId = 0;
            pMbxTfer->dwDataLen = (pMbxTfer->MbxTferDesc).dwMaxDataLen;
            local_360 = emCoeGetODList(dwInstanceID,pMbxTfer,dwNodeId,1,dwTimeout);
            if (local_360 == 0x9811010e) {
              local_378 = (void *)0x0;
            }
            else {
              HandleMbxTferReqError
                        (poLog,"CoeReadObjectDictionary: Error in emCoeGetODList(ALL)",local_360,
                         pMbxTfer);
              if (local_360 != 0) {
                local_378 = (void *)0x0;
                goto LAB_0014b112;
              }
              uVar16 = (ulong)((uint)(pMbxTfer->MbxData).CoE_ODList.wLen * 2);
              local_378 = malloc(uVar16);
              if (local_378 == (void *)0x0) {
                local_378 = (void *)0x0;
                local_360 = EVar3;
                goto LAB_0014b112;
              }
              memset(local_378,0,uVar16);
              if (1 < nVerbosePrinting) {
                CAtEmLogging::LogMsg(poLog,"Complete OD list:");
              }
              if ((pMbxTfer->MbxData).CoE_ODList.wLen == 0) {
                uVar13 = 0;
              }
              else {
                uVar17 = 1;
                uVar16 = 0;
                uVar13 = 0;
                do {
                  *(EC_T_WORD *)((long)local_378 + (ulong)uVar13 * 2) =
                       (pMbxTfer->MbxData).CoE_ODList.pwOdList[uVar16];
                  if ((1 < nVerbosePrinting) &&
                     (CAtEmLogging::LogMsgAdd(poLog,"%04X "),
                     (int)(uVar17 / 10) * 10 + -1 == (int)uVar16)) {
                    CAtEmLogging::LogMsg(poLog,"");
                  }
                  uVar13 = (uVar13 + 1) -
                           (ushort)(*(short *)((long)local_378 + (ulong)uVar13 * 2) == 0);
                  uVar16 = uVar16 + 1;
                  uVar17 = (ulong)((int)uVar17 + 1);
                } while (uVar16 < (pMbxTfer->MbxData).CoE_ODList.wLen);
              }
              if (1 < nVerbosePrinting) {
                CAtEmLogging::LogMsg(poLog,"");
                LinuxSleep(2);
              }
              pMbxTfer->eTferStatus = eMbxTferStatus_Idle;
              pMbxTfer->dwClntId = dwClientId;
              pMbxTfer->dwTferId = 1;
              pMbxTfer->dwDataLen = (pMbxTfer->MbxTferDesc).dwMaxDataLen;
              local_360 = emCoeGetODList(dwInstanceID,pMbxTfer,dwNodeId,2,dwTimeout);
              if (local_360 == 0x9811010e) {
                local_360 = 0x9811010e;
                goto LAB_0014b112;
              }
              HandleMbxTferReqError
                        (poLog,"CoeReadObjectDictionary: Error in emCoeGetODList(RxPdoMap)",
                         local_360,pMbxTfer);
              if (local_360 != 0) goto LAB_0014b112;
              if (1 < nVerbosePrinting) {
                CAtEmLogging::LogMsg(poLog,"RX PDO Mappable Objects:");
                if ((pMbxTfer->MbxData).CoE_ODList.wLen != 0) {
                  iVar10 = -1;
                  uVar16 = 1;
                  uVar17 = 0;
                  do {
                    CAtEmLogging::LogMsgAdd
                              (poLog,"%04X ",(ulong)(pMbxTfer->MbxData).CoE_ODList.pwOdList[uVar17])
                    ;
                    if ((int)(uVar16 / 10) * 10 + iVar10 == 0) {
                      CAtEmLogging::LogMsg(poLog,"");
                    }
                    uVar17 = uVar17 + 1;
                    iVar10 = iVar10 + -1;
                    uVar16 = (ulong)((int)uVar16 + 1);
                  } while (uVar17 < (pMbxTfer->MbxData).CoE_ODList.wLen);
                }
                CAtEmLogging::LogMsg(poLog,"");
              }
              pMbxTfer->eTferStatus = eMbxTferStatus_Idle;
              pMbxTfer->dwClntId = dwClientId;
              pMbxTfer->dwTferId = 2;
              pMbxTfer->dwDataLen = (pMbxTfer->MbxTferDesc).dwMaxDataLen;
              local_360 = emCoeGetODList(dwInstanceID,pMbxTfer,dwNodeId,3,dwTimeout);
              if (local_360 != 0x9811010e) {
                HandleMbxTferReqError
                          (poLog,"CoeReadObjectDictionary: Error in emCoeGetODList(TxPdoMap)",
                           local_360,pMbxTfer);
                if (local_360 == 0) {
                  if (nVerbosePrinting < 2) {
                    pMbxTfer->eTferStatus = eMbxTferStatus_Idle;
                  }
                  else {
                    CAtEmLogging::LogMsg(poLog,"TX PDO Mappable Objects:");
                    if ((pMbxTfer->MbxData).CoE_ODList.wLen != 0) {
                      iVar10 = -1;
                      uVar16 = 1;
                      uVar17 = 0;
                      do {
                        CAtEmLogging::LogMsgAdd
                                  (poLog,"%04X ",
                                   (ulong)(pMbxTfer->MbxData).CoE_ODList.pwOdList[uVar17]);
                        if ((int)(uVar16 / 10) * 10 + iVar10 == 0) {
                          CAtEmLogging::LogMsg(poLog,"");
                        }
                        uVar17 = uVar17 + 1;
                        iVar10 = iVar10 + -1;
                        uVar16 = (ulong)((int)uVar16 + 1);
                      } while (uVar17 < (pMbxTfer->MbxData).CoE_ODList.wLen);
                    }
                    CAtEmLogging::LogMsg(poLog,"");
                    pMbxTfer->eTferStatus = eMbxTferStatus_Idle;
                    CAtEmLogging::LogMsg(poLog,"");
                    CAtEmLogging::LogMsg
                              (poLog,"*************************************************************"
                              );
                    CAtEmLogging::LogMsg
                              (poLog,"****                  OBJECT DESCRIPTION                 ****"
                              );
                    CAtEmLogging::LogMsg
                              (poLog,"*************************************************************"
                              );
                  }
                  if (uVar13 != 0) {
                    local_330 = 3;
                    local_358 = 0;
LAB_0014b633:
                    local_360 = 0;
                    if (*pbStopReading == 0) {
                      *pEVar6 = dwClientId;
                      pEVar6[5] = pEVar6[1];
                      pEVar6[10] = local_330;
                      local_330 = local_330 + 1;
                      local_360 = emCoeGetObjectDesc(dwInstanceID,pEVar6,dwNodeId,
                                                     *(undefined2 *)
                                                      ((long)local_378 + local_358 * 2),dwTimeout);
                      if (local_360 != 0x9811010e) {
                        HandleMbxTferReqError
                                  (poLog,"CoeReadObjectDictionary: Error in emCoeGetObjectDesc",
                                   local_360,pMbxTfer);
                        if (local_360 != 0) goto LAB_0014b6b2;
                        if (1 < nVerbosePrinting) {
                          szObName[0x50] = '\0';
                          szObName[0x51] = '\0';
                          szObName[0x52] = '\0';
                          szObName[0x53] = '\0';
                          szObName[0x54] = '\0';
                          szObName[0x55] = '\0';
                          szObName[0x56] = '\0';
                          szObName[0x57] = '\0';
                          szObName[0x58] = '\0';
                          szObName[0x59] = '\0';
                          szObName[0x5a] = '\0';
                          szObName[0x5b] = '\0';
                          szObName[0x5c] = '\0';
                          szObName[0x5d] = '\0';
                          szObName[0x5e] = '\0';
                          szObName[0x5f] = '\0';
                          szObName[0x40] = '\0';
                          szObName[0x41] = '\0';
                          szObName[0x42] = '\0';
                          szObName[0x43] = '\0';
                          szObName[0x44] = '\0';
                          szObName[0x45] = '\0';
                          szObName[0x46] = '\0';
                          szObName[0x47] = '\0';
                          szObName[0x48] = '\0';
                          szObName[0x49] = '\0';
                          szObName[0x4a] = '\0';
                          szObName[0x4b] = '\0';
                          szObName[0x4c] = '\0';
                          szObName[0x4d] = '\0';
                          szObName[0x4e] = '\0';
                          szObName[0x4f] = '\0';
                          szObName[0x30] = '\0';
                          szObName[0x31] = '\0';
                          szObName[0x32] = '\0';
                          szObName[0x33] = '\0';
                          szObName[0x34] = '\0';
                          szObName[0x35] = '\0';
                          szObName[0x36] = '\0';
                          szObName[0x37] = '\0';
                          szObName[0x38] = '\0';
                          szObName[0x39] = '\0';
                          szObName[0x3a] = '\0';
                          szObName[0x3b] = '\0';
                          szObName[0x3c] = '\0';
                          szObName[0x3d] = '\0';
                          szObName[0x3e] = '\0';
                          szObName[0x3f] = '\0';
                          szObName[0x20] = '\0';
                          szObName[0x21] = '\0';
                          szObName[0x22] = '\0';
                          szObName[0x23] = '\0';
                          szObName[0x24] = '\0';
                          szObName[0x25] = '\0';
                          szObName[0x26] = '\0';
                          szObName[0x27] = '\0';
                          szObName[0x28] = '\0';
                          szObName[0x29] = '\0';
                          szObName[0x2a] = '\0';
                          szObName[0x2b] = '\0';
                          szObName[0x2c] = '\0';
                          szObName[0x2d] = '\0';
                          szObName[0x2e] = '\0';
                          szObName[0x2f] = '\0';
                          szObName[0x10] = '\0';
                          szObName[0x11] = '\0';
                          szObName[0x12] = '\0';
                          szObName[0x13] = '\0';
                          szObName[0x14] = '\0';
                          szObName[0x15] = '\0';
                          szObName[0x16] = '\0';
                          szObName[0x17] = '\0';
                          szObName[0x18] = '\0';
                          szObName[0x19] = '\0';
                          szObName[0x1a] = '\0';
                          szObName[0x1b] = '\0';
                          szObName[0x1c] = '\0';
                          szObName[0x1d] = '\0';
                          szObName[0x1e] = '\0';
                          szObName[0x1f] = '\0';
                          szObName[0] = '\0';
                          szObName[1] = '\0';
                          szObName[2] = '\0';
                          szObName[3] = '\0';
                          szObName[4] = '\0';
                          szObName[5] = '\0';
                          szObName[6] = '\0';
                          szObName[7] = '\0';
                          szObName[8] = '\0';
                          szObName[9] = '\0';
                          szObName[10] = '\0';
                          szObName[0xb] = '\0';
                          szObName[0xc] = '\0';
                          szObName[0xd] = '\0';
                          szObName[0xe] = '\0';
                          szObName[0xf] = '\0';
                          szObName[0x60] = '\0';
                          szObName[0x61] = '\0';
                          szObName[0x62] = '\0';
                          szObName[99] = '\0';
                          uVar4 = (ushort)pEVar6[0xd];
                          if (0x62 < (ushort)pEVar6[0xd]) {
                            uVar4 = 99;
                          }
                          strncpy(szObName,*(char **)(pEVar6 + 0xe),(ulong)uVar4);
                          szObName[uVar4] = '\0';
                          pcVar15 = "mandatory";
                          if (*(char *)((long)pEVar6 + 0x31) == '\0') {
                            pcVar15 = "optional";
                          }
                          CAtEmLogging::LogMsg
                                    (poLog,"%04x %s: type 0x%04x, code=0x%02x, %s, SubIds=%d",
                                     (ulong)(ushort)pEVar6[0xb],szObName,
                                     (ulong)*(ushort *)((long)pEVar6 + 0x2e),
                                     (ulong)(byte)pEVar6[0xc],pcVar15,
                                     (ulong)*(byte *)((long)pEVar6 + 0x32));
                          if (dwNodeId == 0x10000) {
                            LinuxSleep(2);
                          }
                        }
                        uVar4 = (ushort)((char)pEVar6[0xc] == '\a') * 2 - 1;
                        uVar11 = 0;
LAB_0014b7d2:
                        pMbxTfer_00->dwClntId = dwClientId;
                        pMbxTfer_00->dwDataLen = (pMbxTfer_00->MbxTferDesc).dwMaxDataLen;
                        pMbxTfer_00->dwTferId = local_330;
                        local_330 = local_330 + 1;
                        local_360 = emCoeGetEntryDesc(dwInstanceID,pMbxTfer_00,dwNodeId,
                                                      *(undefined2 *)
                                                       ((long)local_378 + local_358 * 2),
                                                      uVar11 & 0xff,0x7f,dwTimeout);
                        bVar18 = true;
                        if ((local_360 == 0x98110006) || (local_360 == 0x98110053)) {
                          local_360 = 0;
                          goto LAB_0014b6b4;
                        }
                        local_32c = 2;
                        if ((local_360 == 0x9811010e) ||
                           (HandleMbxTferReqError
                                      (poLog,"CoeReadObjectDictionary: Error in emCoeGetEntryDesc",
                                       local_360,pMbxTfer_00), local_360 != 0)) goto LAB_0014c221;
                        if (1 < nVerbosePrinting) {
                          szObName._48_8_ = szObName._48_8_ & 0xffffffffffff0000;
                          szObName[0x20] = '\0';
                          szObName[0x21] = '\0';
                          szObName[0x22] = '\0';
                          szObName[0x23] = '\0';
                          szObName[0x24] = '\0';
                          szObName[0x25] = '\0';
                          szObName[0x26] = '\0';
                          szObName[0x27] = '\0';
                          szObName[0x28] = '\0';
                          szObName[0x29] = '\0';
                          szObName[0x2a] = '\0';
                          szObName[0x2b] = '\0';
                          szObName[0x2c] = '\0';
                          szObName[0x2d] = '\0';
                          szObName[0x2e] = '\0';
                          szObName[0x2f] = '\0';
                          szObName[0x10] = '\0';
                          szObName[0x11] = '\0';
                          szObName[0x12] = '\0';
                          szObName[0x13] = '\0';
                          szObName[0x14] = '\0';
                          szObName[0x15] = '\0';
                          szObName[0x16] = '\0';
                          szObName[0x17] = '\0';
                          szObName[0x18] = '\0';
                          szObName[0x19] = '\0';
                          szObName[0x1a] = '\0';
                          szObName[0x1b] = '\0';
                          szObName[0x1c] = '\0';
                          szObName[0x1d] = '\0';
                          szObName[0x1e] = '\0';
                          szObName[0x1f] = '\0';
                          szObName[8] = '\0';
                          szObName[9] = '\0';
                          szObName[10] = '\0';
                          szObName[0xb] = '\0';
                          szObName[0xc] = '\0';
                          szObName[0xd] = '\0';
                          szObName[0xe] = '\0';
                          szObName[0xf] = '\0';
                          szPdoMapInfo[0x30] = '\0';
                          szPdoMapInfo[0x31] = '\0';
                          szPdoMapInfo[0x20] = '\0';
                          szPdoMapInfo[0x21] = '\0';
                          szPdoMapInfo[0x22] = '\0';
                          szPdoMapInfo[0x23] = '\0';
                          szPdoMapInfo[0x24] = '\0';
                          szPdoMapInfo[0x25] = '\0';
                          szPdoMapInfo[0x26] = '\0';
                          szPdoMapInfo[0x27] = '\0';
                          szPdoMapInfo[0x28] = '\0';
                          szPdoMapInfo[0x29] = '\0';
                          szPdoMapInfo[0x2a] = '\0';
                          szPdoMapInfo[0x2b] = '\0';
                          szPdoMapInfo[0x2c] = '\0';
                          szPdoMapInfo[0x2d] = '\0';
                          szPdoMapInfo[0x2e] = '\0';
                          szPdoMapInfo[0x2f] = '\0';
                          szPdoMapInfo[0x10] = '\0';
                          szPdoMapInfo[0x11] = '\0';
                          szPdoMapInfo[0x12] = '\0';
                          szPdoMapInfo[0x13] = '\0';
                          szPdoMapInfo[0x14] = '\0';
                          szPdoMapInfo[0x15] = '\0';
                          szPdoMapInfo[0x16] = '\0';
                          szPdoMapInfo[0x17] = '\0';
                          szPdoMapInfo[0x18] = '\0';
                          szPdoMapInfo[0x19] = '\0';
                          szPdoMapInfo[0x1a] = '\0';
                          szPdoMapInfo[0x1b] = '\0';
                          szPdoMapInfo[0x1c] = '\0';
                          szPdoMapInfo[0x1d] = '\0';
                          szPdoMapInfo[0x1e] = '\0';
                          szPdoMapInfo[0x1f] = '\0';
                          szPdoMapInfo[0] = '\0';
                          szPdoMapInfo[1] = '\0';
                          szPdoMapInfo[2] = '\0';
                          szPdoMapInfo[3] = '\0';
                          szPdoMapInfo[4] = '\0';
                          szPdoMapInfo[5] = '\0';
                          szPdoMapInfo[6] = '\0';
                          szPdoMapInfo[7] = '\0';
                          szPdoMapInfo[8] = '\0';
                          szPdoMapInfo[9] = '\0';
                          szPdoMapInfo[10] = '\0';
                          szPdoMapInfo[0xb] = '\0';
                          szPdoMapInfo[0xc] = '\0';
                          szPdoMapInfo[0xd] = '\0';
                          szPdoMapInfo[0xe] = '\0';
                          szPdoMapInfo[0xf] = '\0';
                          szUnitType[8] = '\0';
                          szUnitType[9] = '\0';
                          szUnitType[0] = '\0';
                          szUnitType[1] = '\0';
                          szUnitType[2] = '\0';
                          szUnitType[3] = '\0';
                          szUnitType[4] = '\0';
                          szUnitType[5] = '\0';
                          szUnitType[6] = '\0';
                          szUnitType[7] = '\0';
                          szDefaultValue[8] = '\0';
                          szDefaultValue[9] = '\0';
                          szDefaultValue[0] = '\0';
                          szDefaultValue[1] = '\0';
                          szDefaultValue[2] = '\0';
                          szDefaultValue[3] = '\0';
                          szDefaultValue[4] = '\0';
                          szDefaultValue[5] = '\0';
                          szDefaultValue[6] = '\0';
                          szDefaultValue[7] = '\0';
                          szMinValue[8] = '\0';
                          szMinValue[9] = '\0';
                          szMinValue[0] = '\0';
                          szMinValue[1] = '\0';
                          szMinValue[2] = '\0';
                          szMinValue[3] = '\0';
                          szMinValue[4] = '\0';
                          szMinValue[5] = '\0';
                          szMinValue[6] = '\0';
                          szMinValue[7] = '\0';
                          szMaxValue[8] = '\0';
                          szMaxValue[9] = '\0';
                          szMaxValue[0] = '\0';
                          szMaxValue[1] = '\0';
                          szMaxValue[2] = '\0';
                          szMaxValue[3] = '\0';
                          szMaxValue[4] = '\0';
                          szMaxValue[5] = '\0';
                          szMaxValue[6] = '\0';
                          szMaxValue[7] = '\0';
                          szDescription[0x30] = '\0';
                          szDescription[0x31] = '\0';
                          szDescription[0x20] = '\0';
                          szDescription[0x21] = '\0';
                          szDescription[0x22] = '\0';
                          szDescription[0x23] = '\0';
                          szDescription[0x24] = '\0';
                          szDescription[0x25] = '\0';
                          szDescription[0x26] = '\0';
                          szDescription[0x27] = '\0';
                          szDescription[0x28] = '\0';
                          szDescription[0x29] = '\0';
                          szDescription[0x2a] = '\0';
                          szDescription[0x2b] = '\0';
                          szDescription[0x2c] = '\0';
                          szDescription[0x2d] = '\0';
                          szDescription[0x2e] = '\0';
                          szDescription[0x2f] = '\0';
                          szDescription[0x10] = '\0';
                          szDescription[0x11] = '\0';
                          szDescription[0x12] = '\0';
                          szDescription[0x13] = '\0';
                          szDescription[0x14] = '\0';
                          szDescription[0x15] = '\0';
                          szDescription[0x16] = '\0';
                          szDescription[0x17] = '\0';
                          szDescription[0x18] = '\0';
                          szDescription[0x19] = '\0';
                          szDescription[0x1a] = '\0';
                          szDescription[0x1b] = '\0';
                          szDescription[0x1c] = '\0';
                          szDescription[0x1d] = '\0';
                          szDescription[0x1e] = '\0';
                          szDescription[0x1f] = '\0';
                          szDescription[0] = '\0';
                          szDescription[1] = '\0';
                          szDescription[2] = '\0';
                          szDescription[3] = '\0';
                          szDescription[4] = '\0';
                          szDescription[5] = '\0';
                          szDescription[6] = '\0';
                          szDescription[7] = '\0';
                          szDescription[8] = '\0';
                          szDescription[9] = '\0';
                          szDescription[10] = '\0';
                          szDescription[0xb] = '\0';
                          szDescription[0xc] = '\0';
                          szDescription[0xd] = '\0';
                          szDescription[0xe] = '\0';
                          szDescription[0xf] = '\0';
                          bVar1 = (pMbxTfer_00->MbxData).CoE_EntryDesc.byObAccess;
                          szObName[0] = 'R';
                          if ((bVar1 & 1) == 0) {
                            szObName[0] = ' ';
                          }
                          if ((bVar1 & 8) == 0) {
                            szObName[1] = ' ';
                          }
                          else {
                            szObName[1] = 'W';
                          }
                          szObName[2] = '.';
                          szObName[0] = (EC_T_CHAR)szObName._0_2_;
                          szObName[1] = SUB21(szObName._0_2_,1);
                          if (((pMbxTfer_00->MbxData).CoE_EntryDesc.byObAccess & 2) == 0) {
                            szObName[3] = ' ';
                          }
                          else {
                            szObName[3] = 'R';
                          }
                          if (((pMbxTfer_00->MbxData).CoE_EntryDesc.byObAccess & 0x10) == 0) {
                            szObName[4] = ' ';
                            szObName[0] = (EC_T_CHAR)szObName._0_4_;
                            szObName[1] = SUB41(szObName._0_4_,1);
                            szObName[2] = SUB41(szObName._0_4_,2);
                            szObName[3] = SUB41(szObName._0_4_,3);
                          }
                          else {
                            szObName[4] = 'W';
                            szObName[0] = (EC_T_CHAR)szObName._0_4_;
                            szObName[1] = SUB41(szObName._0_4_,1);
                            szObName[2] = SUB41(szObName._0_4_,2);
                            szObName[3] = SUB41(szObName._0_4_,3);
                          }
                          szObName[5] = '.';
                          szObName[0] = (EC_T_CHAR)szObName._0_5_;
                          szObName[1] = SUB51(szObName._0_5_,1);
                          szObName[2] = SUB51(szObName._0_5_,2);
                          szObName[3] = SUB51(szObName._0_5_,3);
                          szObName[4] = SUB51(szObName._0_5_,4);
                          if (((pMbxTfer_00->MbxData).CoE_EntryDesc.byObAccess & 4) == 0) {
                            szObName[6] = ' ';
                          }
                          else {
                            szObName[6] = 'R';
                          }
                          if (((pMbxTfer_00->MbxData).CoE_EntryDesc.byObAccess & 0x20) == 0) {
                            szObName[7] = ' ';
                            szObName[0] = (EC_T_CHAR)szObName._0_7_;
                            szObName[1] = SUB71(szObName._0_7_,1);
                            szObName[2] = SUB71(szObName._0_7_,2);
                            szObName[3] = SUB71(szObName._0_7_,3);
                            szObName[4] = SUB71(szObName._0_7_,4);
                            szObName[5] = SUB71(szObName._0_7_,5);
                            szObName[6] = SUB71(szObName._0_7_,6);
                          }
                          else {
                            szObName[7] = 'W';
                            szObName[0] = (EC_T_CHAR)szObName._0_7_;
                            szObName[1] = SUB71(szObName._0_7_,1);
                            szObName[2] = SUB71(szObName._0_7_,2);
                            szObName[3] = SUB71(szObName._0_7_,3);
                            szObName[4] = SUB71(szObName._0_7_,4);
                            szObName[5] = SUB71(szObName._0_7_,5);
                            szObName[6] = SUB71(szObName._0_7_,6);
                          }
                          if ((pMbxTfer_00->MbxData).CoE_EntryDesc.bRxPdoMapping != 0) {
                            szPdoMapInfo[0x20] = '\0';
                            szPdoMapInfo[0x21] = '\0';
                            szPdoMapInfo[0x22] = '\0';
                            szPdoMapInfo[0x23] = '\0';
                            szPdoMapInfo[0x24] = '\0';
                            szPdoMapInfo[0x25] = '\0';
                            szPdoMapInfo[0x26] = '\0';
                            szPdoMapInfo[0x27] = '\0';
                            szPdoMapInfo[0x28] = '\0';
                            szPdoMapInfo[0x29] = '\0';
                            szPdoMapInfo[0x2a] = '\0';
                            szPdoMapInfo[0x2b] = '\0';
                            szPdoMapInfo[0x2c] = '\0';
                            szPdoMapInfo[0x2d] = '\0';
                            szPdoMapInfo[0x2e] = '\0';
                            szPdoMapInfo[0x2f] = '\0';
                            szPdoMapInfo[0x10] = '\0';
                            szPdoMapInfo[0x11] = '\0';
                            szPdoMapInfo[0x12] = '\0';
                            szPdoMapInfo[0x13] = '\0';
                            szPdoMapInfo[0x14] = '\0';
                            szPdoMapInfo[0x15] = '\0';
                            szPdoMapInfo[0x16] = '\0';
                            szPdoMapInfo[0x17] = '\0';
                            szPdoMapInfo[0x18] = '\0';
                            szPdoMapInfo[0x19] = '\0';
                            szPdoMapInfo[0x1a] = '\0';
                            szPdoMapInfo[0x1b] = '\0';
                            szPdoMapInfo[0x1c] = '\0';
                            szPdoMapInfo[0x1d] = '\0';
                            szPdoMapInfo[0x1e] = '\0';
                            szPdoMapInfo[0x1f] = '\0';
                            builtin_memcpy(szPdoMapInfo,"-RxPDO",7);
                            szPdoMapInfo[7] = '\0';
                            szPdoMapInfo[8] = '\0';
                            szPdoMapInfo[9] = '\0';
                            szPdoMapInfo[10] = '\0';
                            szPdoMapInfo[0xb] = '\0';
                            szPdoMapInfo[0xc] = '\0';
                            szPdoMapInfo[0xd] = '\0';
                            szPdoMapInfo[0xe] = '\0';
                            szPdoMapInfo[0xf] = '\0';
                            szPdoMapInfo[0x30] = '\0';
                            szPdoMapInfo[0x31] = '\0';
                            if ((pMbxTfer_00->MbxData).CoE_EntryDesc.bTxPdoMapping != 0) {
                              sVar7 = strlen(szPdoMapInfo);
                              strncpy(szPdoMapInfo + sVar7,"+TxPDO",0x31 - sVar7);
                            }
                          }
                          uVar5 = 0;
                          if (((pMbxTfer_00->MbxData).CoE_EntryDesc.byValueInfo & 8) != 0) {
                            EcSnprintf(szUnitType,9,", UnitType 0x%08X",
                                       *(undefined4 *)(pMbxTfer_00->MbxData).CoE_EntryDesc.pbyData);
                            uVar5 = 4;
                          }
                          if (((pMbxTfer_00->MbxData).CoE_EntryDesc.byValueInfo & 0x10) != 0) {
                            builtin_memcpy(szDefaultValue,", Defaul",8);
                            szDefaultValue[8] = 't';
                            uVar5 = uVar5 + ((pMbxTfer_00->MbxData).CoE_ODList.wRes + 7 >> 3);
                          }
                          if (((pMbxTfer_00->MbxData).CoE_EntryDesc.byValueInfo & 0x20) != 0) {
                            builtin_memcpy(szMinValue,", Min",6);
                            szMinValue[6] = '\0';
                            szMinValue[7] = '\0';
                            szMinValue._8_2_ = szMinValue._8_2_ & 0xff00;
                            uVar5 = uVar5 + ((pMbxTfer_00->MbxData).CoE_ODList.wRes + 7 >> 3);
                          }
                          if (((pMbxTfer_00->MbxData).CoE_EntryDesc.byValueInfo & 0x40) != 0) {
                            builtin_memcpy(szMaxValue,", Max",6);
                            szMaxValue[6] = '\0';
                            szMaxValue[7] = '\0';
                            szMaxValue._8_2_ = szMaxValue._8_2_ & 0xff00;
                            uVar5 = uVar5 + ((pMbxTfer_00->MbxData).CoE_ODList.wRes + 7 >> 3);
                          }
                          uVar9 = (uint)(pMbxTfer_00->MbxData).CoE_EntryDesc.wDataLen;
                          iVar10 = uVar9 - uVar5;
                          if (iVar10 != 0 && uVar5 <= uVar9) {
                            iVar14 = iVar10 + 1;
                            if (0x2f < iVar10) {
                              iVar14 = 0x31;
                            }
                            EcSnprintf(szDescription,iVar14,"%s",
                                       (pMbxTfer_00->MbxData).CoE_EntryDesc.pbyData + uVar5);
                          }
                          CAtEmLogging::LogMsg
                                    (poLog,"%04x:%d %s: type=0x%04x, len=%02d, %s%s%s",
                                     (ulong)(pMbxTfer_00->MbxData).CoE.wStationAddress,
                                     (ulong)(pMbxTfer_00->MbxData).CoE_EntryDesc.byObSubIndex,
                                     szDescription,(ulong)(pMbxTfer_00->MbxData).CoE_ODList.wLen,
                                     (ulong)(pMbxTfer_00->MbxData).CoE_ODList.wRes,szObName,
                                     szPdoMapInfo,szUnitType,szDefaultValue,szMinValue,szMaxValue);
                          if (dwNodeId == 0x10000) {
                            LinuxSleep(2);
                          }
                        }
                        local_32c = 0;
                        if ((pMbxTfer_00->MbxData).CoE_ODList.wLen == 0) {
                          local_360 = 0;
                          goto LAB_0014bec5;
                        }
                        if (bPerformUpload == 0) {
                          local_360 = 0;
                          goto LAB_0014bebd;
                        }
                        memset(szObName,0,0x200);
                        szPdoMapInfo._0_8_ = szPdoMapInfo._0_8_ & 0xffffffff00000000;
                        uVar2 = (pMbxTfer_00->MbxData).CoE_ODList.wRes;
                        uVar5 = uVar2 + 7 >> 3;
                        if (0x1000 < uVar2) {
                          uVar5 = 0x200;
                        }
                        local_384 = (byte)uVar11;
                        local_360 = emCoeSdoUpload(dwInstanceID,dwNodeId,
                                                   *(undefined2 *)((long)local_378 + local_358 * 2),
                                                   local_384,szObName,uVar5,szPdoMapInfo,dwTimeout,0
                                                  );
                        if (local_360 == 0x9811010e) {
                          iVar10 = 2;
                          goto LAB_0014beaf;
                        }
                        if (local_360 != 0) {
                          uVar8 = ecatGetText(local_360);
                          CAtEmLogging::LogError
                                    (poLog,
                                     "CoeReadObjectDictionary: Error in ecatCoeSdoUpload: %s (0x%lx)"
                                     ,uVar8,(ulong)local_360);
                          iVar10 = 0x11;
                          goto LAB_0014beaf;
                        }
                        uVar16 = szObName._0_8_ & 0xff;
                        uVar2 = (byte)szObName[0] + 1 & 0xff;
                        if ((pEVar6[0xc] & 0xfe) != 8) {
                          uVar2 = uVar4;
                        }
                        if ((short)uVar11 != 0) {
                          uVar2 = uVar4;
                        }
                        iVar10 = 0;
                        uVar4 = uVar2;
                        if (nVerbosePrinting < 2) goto LAB_0014be78;
                        uVar2 = (pMbxTfer_00->MbxData).CoE_ODList.wLen;
                        switch(uVar2) {
                        case 1:
                        case 2:
                        case 5:
                          goto switchD_0014bd6c_caseD_1;
                        case 3:
                          uVar12 = (ulong)*(ushort *)((long)local_378 + local_358 * 2);
                          uVar17 = (ulong)(uVar11 & 0xff);
                          uVar16 = szObName._0_8_ & 0xffff;
                          pcVar15 = "%04x:%d SI16: %04d";
                          goto LAB_0014be17;
                        case 4:
                          uVar12 = (ulong)*(ushort *)((long)local_378 + local_358 * 2);
                          uVar17 = (ulong)(uVar11 & 0xff);
                          uVar16 = szObName._0_8_ & 0xffffffff;
                          pcVar15 = "%04x:%d SI32: %08ld";
                          goto LAB_0014be17;
                        case 6:
                          uVar12 = (ulong)*(ushort *)((long)local_378 + local_358 * 2);
                          uVar17 = (ulong)(uVar11 & 0xff);
                          uVar16 = szObName._0_8_ & 0xffff;
                          pcVar15 = "%04x:%d WORD: 0x%04X";
                          goto LAB_0014be17;
                        case 7:
                          uVar12 = (ulong)*(ushort *)((long)local_378 + local_358 * 2);
                          uVar17 = (ulong)(uVar11 & 0xff);
                          uVar16 = szObName._0_8_ & 0xffffffff;
                          pcVar15 = "%04x:%d DWRD: 0x%08lX";
                          goto LAB_0014be17;
                        case 8:
                        case 0xb:
                        case 0xc:
                        case 0xd:
                        case 0xe:
                        case 0xf:
                        case 0x10:
                        case 0x11:
                        case 0x12:
                        case 0x13:
                        case 0x14:
                        case 0x15:
                        case 0x16:
                        case 0x17:
                        case 0x18:
                        case 0x1a:
switchD_0014bd6c_caseD_8:
                          CAtEmLogging::LogMsg
                                    (poLog,"%04x:%d DFLT: ",
                                     (ulong)*(ushort *)((long)local_378 + local_358 * 2));
                          if (szPdoMapInfo._0_4_ != 0) {
                            uVar16 = 0;
                            do {
                              CAtEmLogging::LogMsgAdd(poLog,"%02x ",(ulong)(byte)szObName[uVar16]);
                              if ((uVar16 & 7) == 0 && uVar16 != 0) {
                                CAtEmLogging::LogMsgAdd(poLog," ");
                              }
                              if ((uVar16 & 0x1f) == 0 && uVar16 != 0) {
                                CAtEmLogging::LogMsgAdd(poLog,"\n");
                              }
                              uVar16 = uVar16 + 1;
                            } while (uVar16 < (szPdoMapInfo._0_8_ & 0xffffffff));
                          }
                          CAtEmLogging::LogMsg(poLog,"");
                          break;
                        case 9:
                          CAtEmLogging::LogMsg
                                    (poLog,"%04x:%d STRG: %s",
                                     (ulong)*(ushort *)((long)local_378 + local_358 * 2),
                                     (ulong)(uVar11 & 0xff),szObName);
                          break;
                        case 10:
                          uVar2 = *(ushort *)((long)local_378 + local_358 * 2);
                          if ((uVar2 == 0x10f3) && (5 < local_384)) {
                            if ((szObName._4_2_ & 0xf) == 1) {
                              pcVar15 = "WARN";
                            }
                            else {
                              pcVar15 = "ERR";
                              if (((szObName._4_2_ & 0xf) != 2) &&
                                 (pcVar15 = "UNK", (szObName._0_8_ & 0xf00000000) == 0)) {
                                pcVar15 = "INF";
                              }
                            }
                            CAtEmLogging::LogMsg
                                      (poLog,
                                       "%04x:%d DIAG # 0x%lx type <%s> Text 0x%x Time: 0x%x.%x",
                                       0x10f3,(ulong)local_384,szObName._0_8_ & 0xffffffff,pcVar15,
                                       (ulong)szObName._0_8_ >> 0x30,(ulong)szObName._8_8_ >> 0x20,
                                       szObName._8_8_);
                            ParseDiagMsg(poLog,szObName);
                          }
                          else {
                            CAtEmLogging::LogMsg
                                      (poLog,"%04x:%d OCTS: %s",(ulong)uVar2,(ulong)(uVar11 & 0xff),
                                       szObName);
                          }
                          break;
                        case 0x19:
                          CAtEmLogging::LogMsg
                                    (poLog,"%04x:%d US48: %02X:%02X:%02X:%02X:%02X:%02X",
                                     (ulong)*(ushort *)((long)local_378 + local_358 * 2),
                                     (ulong)(uVar11 & 0xff),uVar16,(ulong)szObName._0_8_ >> 8 & 0xff
                                     ,(ulong)szObName._0_8_ >> 0x10 & 0xff,
                                     (ulong)szObName._0_8_ >> 0x18 & 0xff,
                                     (ulong)szObName._0_8_ >> 0x20 & 0xff,
                                     (ulong)szObName._0_8_ >> 0x28 & 0xff);
                          break;
                        case 0x1b:
                          CAtEmLogging::LogMsg
                                    (poLog,"%04x:%d QWRD: 0x%08lX.%08lX",
                                     (ulong)*(ushort *)((long)local_378 + local_358 * 2),
                                     (ulong)(uVar11 & 0xff),(ulong)szObName._0_8_ >> 0x20);
                          break;
                        default:
                          if (7 < uVar2 - 0x30) goto switchD_0014bd6c_caseD_8;
                          goto switchD_0014bd6c_caseD_1;
                        }
                        goto LAB_0014be1e;
                      }
                      local_360 = 0x9811010e;
LAB_0014b6b2:
                      bVar18 = false;
                      goto LAB_0014b6b4;
                    }
                    goto LAB_0014b112;
                  }
LAB_0014c230:
                  local_360 = 0;
                }
                goto LAB_0014b112;
              }
            }
            local_360 = 0x9811010e;
            goto LAB_0014b112;
          }
        }
        pMbxTfer_00 = (EC_T_MBXTFER *)0x0;
        local_378 = (void *)0x0;
        goto LAB_0014b112;
      }
    }
  }
  local_360 = EVar3;
  pEVar6 = (EC_T_DWORD *)0x0;
  pMbxTfer = (EC_T_MBXTFER *)0x0;
  pMbxTfer_00 = (EC_T_MBXTFER *)0x0;
  local_378 = (void *)0x0;
LAB_0014b112:
  if (pMbxTfer != (EC_T_MBXTFER *)0x0) {
    emMbxTferDelete(dwInstanceID);
  }
  if (pEVar6 != (EC_T_DWORD *)0x0) {
    emMbxTferDelete(dwInstanceID,pEVar6);
  }
  if (pMbxTfer_00 != (EC_T_MBXTFER *)0x0) {
    emMbxTferDelete(dwInstanceID,pMbxTfer_00);
  }
  if (local_378 != (void *)0x0) {
    free(local_378);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__ptr != (undefined8 *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (undefined8 *)0x0) {
    free(__ptr_00);
  }
  return local_360;
switchD_0014bd6c_caseD_1:
  uVar12 = (ulong)*(ushort *)((long)local_378 + local_358 * 2);
  uVar17 = (ulong)(uVar11 & 0xff);
  pcVar15 = "%04x:%d BYTE: 0x%02X";
LAB_0014be17:
  CAtEmLogging::LogMsg(poLog,pcVar15,uVar12,uVar17,uVar16);
LAB_0014be1e:
  if ((local_384 == 1) && (0x2fff < *(ushort *)((long)local_378 + local_358 * 2))) {
    iVar10 = 0;
    if (szObName._0_4_ == 0) {
      iVar10 = 0xf;
    }
    if (szObName._0_4_ != 0 && dwNodeId == 0x10000) {
LAB_0014be86:
      LinuxSleep(2);
      goto LAB_0014be90;
    }
LAB_0014be78:
    local_360 = 0;
  }
  else {
    if (dwNodeId == 0x10000) goto LAB_0014be86;
LAB_0014be90:
    local_360 = 0;
    iVar10 = 0;
  }
LAB_0014beaf:
  if (iVar10 == 0) {
LAB_0014bebd:
    pEVar6[8] = 0;
  }
  else if (iVar10 != 0x11) {
    local_32c = iVar10;
    if (iVar10 == 0xf) {
      bVar18 = true;
      goto LAB_0014b6b4;
    }
LAB_0014c221:
    bVar18 = local_32c == 0;
LAB_0014b6b4:
    if (!bVar18) goto LAB_0014b112;
    local_358 = local_358 + 1;
    if ((uVar13 <= local_358) || (local_360 != 0)) goto LAB_0014c230;
    goto LAB_0014b633;
  }
LAB_0014bec5:
  uVar11 = uVar11 + 1;
  if ((uVar4 <= (ushort)uVar11) || (local_360 != 0)) goto LAB_0014c221;
  goto LAB_0014b7d2;
}

Assistant:

EC_T_DWORD CoeReadObjectDictionary
   (EC_T_DWORD              dwInstanceID
   ,CAtEmLogging*           poLog               /**< [in]   Logging Instance */
   ,EC_T_INT                nVerbosePrinting   /**< [in]   Print messages */
   ,EC_T_BOOL*              pbStopReading   /**< [in]   Pointer to shutdwon flag */
   ,EC_T_DWORD              dwClientId      /**< [in]   Current client ID */
   ,EC_T_DWORD              dwNodeId        /**< [in]   Slave Id to query ODL from  */
   ,EC_T_BOOL               bPerformUpload  /**< [in]   EC_TRUE: do SDO Upload */
   ,EC_T_DWORD              dwTimeout       /**< [in]   Individual call timeout */
                                  )
{
    /* buffer sizes */
#define CROD_ODLTFER_SIZE       ((EC_T_DWORD)0x1200)
#define CROD_OBDESC_SIZE        ((EC_T_DWORD)100)
#define CROD_ENTRYDESC_SIZE     ((EC_T_DWORD)100)
#define CROD_MAXSISDO_SIZE      ((EC_T_DWORD)0x200)
#define MAX_OBNAME_LEN          ((EC_T_DWORD)100)

    /* variables */
    EC_T_DWORD          dwRetVal                = EC_E_ERROR;   /* return value */
    EC_T_DWORD          dwRes                   = EC_E_ERROR;   /* tmp return value for API calls */
    EC_T_BYTE*          pbyODLTferBuffer        = EC_NULL;      /* OD List */
    EC_T_BYTE*          pbyOBDescTferBuffer     = EC_NULL;      /* OB Desc */
    EC_T_BYTE*          pbyGetEntryTferBuffer   = EC_NULL;      /* Entry Desc */
    EC_T_MBXTFER_DESC   MbxTferDesc             = {0};          /* mailbox transfer descriptor */
    EC_T_MBXTFER*       pMbxGetODLTfer          = EC_NULL;      /* mailbox transfer object for OD list upload */
    EC_T_MBXTFER*       pMbxGetObDescTfer       = EC_NULL;      /* mailbox transfer object for Object description upload */
    EC_T_MBXTFER*       pMbxGetEntryDescTfer    = EC_NULL;      /* mailbox transfer object for Entry description upload */

    EC_T_WORD*          pwODList                = EC_NULL;      /* is going to carry ALL list of OD */
    EC_T_WORD           wODListLen              = 0;            /* used entries in pwODList */
    EC_T_WORD           wIndex                  = 0;            /* index to parse OD List */

    EC_T_BYTE           byValueInfoType         = 0;
    EC_T_DWORD          dwUniqueTransferId      = 0;
    EC_T_BOOL           bReadingMasterOD        = EC_FALSE;

    /* Check Parameters */
    if ((EC_NULL == poLog)
     || (EC_NULL == pbStopReading)
     || (EC_NOWAIT == dwTimeout))
    {
        dwRetVal = EC_E_INVALIDPARM;
        goto Exit;
    }

    /* Create Memory */
    pbyODLTferBuffer        = (EC_T_BYTE*)OsMalloc(CROD_ODLTFER_SIZE);
    pbyOBDescTferBuffer     = (EC_T_BYTE*)OsMalloc(CROD_OBDESC_SIZE);
    pbyGetEntryTferBuffer   = (EC_T_BYTE*)OsMalloc(CROD_ENTRYDESC_SIZE);

    /* check if alloc was ok */
    if ((EC_NULL == pbyODLTferBuffer)
     || (EC_NULL == pbyOBDescTferBuffer)
     || (EC_NULL == pbyGetEntryTferBuffer))
    {
        dwRetVal = EC_E_NOMEMORY;
        goto Exit;
    }

    OsMemset(pbyODLTferBuffer,      0, CROD_ODLTFER_SIZE);
    OsMemset(pbyOBDescTferBuffer,   0, CROD_OBDESC_SIZE);
    OsMemset(pbyGetEntryTferBuffer, 0, CROD_ENTRYDESC_SIZE);

    /* create required MBX Transfer Objects */
    /* mailbox transfer object for OD list upload */
    MbxTferDesc.dwMaxDataLen        = CROD_ODLTFER_SIZE;
    MbxTferDesc.pbyMbxTferDescData  = pbyODLTferBuffer;

    pMbxGetODLTfer = emMbxTferCreate(dwInstanceID, &MbxTferDesc);
    if (EC_NULL == pMbxGetODLTfer)
    {
        dwRetVal = EC_E_NOMEMORY;
        goto Exit;
    }

    /* mailbox transfer object for Object description upload */
    MbxTferDesc.dwMaxDataLen        = CROD_OBDESC_SIZE;
    MbxTferDesc.pbyMbxTferDescData  = pbyOBDescTferBuffer;

    pMbxGetObDescTfer = emMbxTferCreate(dwInstanceID, &MbxTferDesc);
    if (EC_NULL == pMbxGetObDescTfer)
    {
        dwRetVal = EC_E_NOMEMORY;
        goto Exit;
    }

    /* mailbox transfer object for Entry description upload */
    MbxTferDesc.dwMaxDataLen        = CROD_ENTRYDESC_SIZE;
    MbxTferDesc.pbyMbxTferDescData  = pbyGetEntryTferBuffer;

    pMbxGetEntryDescTfer = emMbxTferCreate(dwInstanceID, &MbxTferDesc);
    if (EC_NULL == pMbxGetEntryDescTfer)
    {
        dwRetVal = EC_E_NOMEMORY;
        goto Exit;
    }

    /* Get OD List Type: ALL */
    pMbxGetODLTfer->dwClntId    = dwClientId;
    pMbxGetODLTfer->dwTferId    = dwUniqueTransferId++;
    pMbxGetODLTfer->dwDataLen   = pMbxGetODLTfer->MbxTferDesc.dwMaxDataLen;

    /* get list of object indexes */
    dwRes = emCoeGetODList(dwInstanceID, pMbxGetODLTfer, dwNodeId, eODListType_ALL, dwTimeout);
    if (EC_E_SLAVE_NOT_PRESENT == dwRes)
    {
        dwRetVal = dwRes;
        goto Exit;
    }

    /* wait until transfer object is available incl. logging error */
    HandleMbxTferReqError(poLog, (EC_T_CHAR*)"CoeReadObjectDictionary: Error in emCoeGetODList(ALL)", dwRes, pMbxGetODLTfer);
    if (EC_E_NOERROR != dwRes)
    {
        dwRetVal = dwRes;
        goto Exit;
    }

    /* OD Tfer object now shall contain complete list of OD Objects, store it for more processing */
    pwODList = (EC_T_WORD*)OsMalloc(sizeof(EC_T_WORD) * pMbxGetODLTfer->MbxData.CoE_ODList.wLen);
    if (EC_NULL == pwODList)
    {
        dwRetVal = EC_E_NOMEMORY;
        goto Exit;
    }
    OsMemset(pwODList, 0, sizeof(EC_T_WORD) * pMbxGetODLTfer->MbxData.CoE_ODList.wLen);

    /* reading master OD */
    if (MASTER_SLAVE_ID == dwNodeId)
    {
        bReadingMasterOD = EC_TRUE;
    }

    /* now display Entries of ODList and store non-empty values */
    if (nVerbosePrinting > 1)
    {
        CRODLMsg( "Complete OD list:" );
    }

    /* iterate through all entries in list */
    for (wODListLen = 0, wIndex = 0; wIndex < (pMbxGetODLTfer->MbxData.CoE_ODList.wLen); wIndex++)
    {
        /* store next index */
        pwODList[wODListLen] = pMbxGetODLTfer->MbxData.CoE_ODList.pwOdList[wIndex];

        /* show indices */
        if (nVerbosePrinting > 1)
        {
            CRODLMsgAdd("%04X ", pwODList[wODListLen]);
            if (((wIndex+1) % 10) == 0) CRODLMsg(""); /* break lines each 10 entries */
        }

        /* to store only non empty index entries, increment List Length only if non zero entry */
        if (0 != pwODList[wODListLen])
        {
            wODListLen++;
        }
    }

    /* give logging task a chance to flush */
    if (nVerbosePrinting > 1)
    {
        CRODLMsg("");
        OsSleep(2);
    }
    /* MbxGetODLTfer done */
    pMbxGetODLTfer->eTferStatus = eMbxTferStatus_Idle;

    /* Get OD List Type: RX PDO Map */
    pMbxGetODLTfer->dwClntId    = dwClientId;
    pMbxGetODLTfer->dwTferId    = dwUniqueTransferId++;
    pMbxGetODLTfer->dwDataLen   = pMbxGetODLTfer->MbxTferDesc.dwMaxDataLen;

    dwRes = emCoeGetODList(dwInstanceID, pMbxGetODLTfer, dwNodeId, eODListType_RxPdoMap, dwTimeout);
    if (EC_E_SLAVE_NOT_PRESENT == dwRes)
    {
        dwRetVal = dwRes;
        goto Exit;
    }

    /* wait until transfer object is available incl. logging error */
    HandleMbxTferReqError(poLog, (EC_T_CHAR*)"CoeReadObjectDictionary: Error in emCoeGetODList(RxPdoMap)", dwRes, pMbxGetODLTfer);
    if (EC_E_NOERROR != dwRes)
    {
        dwRetVal = dwRes;
        goto Exit;
    }

    /* now display Entries of ODList */
    if (nVerbosePrinting > 1)
    {
        CRODLMsg( "RX PDO Mappable Objects:" );
        /* iterate through all entries in list */
        for (wIndex = 0; wIndex < (pMbxGetODLTfer->MbxData.CoE_ODList.wLen); wIndex++)
        {
            CRODLMsgAdd("%04X ", pMbxGetODLTfer->MbxData.CoE_ODList.pwOdList[wIndex]);

            if (((wIndex+1) % 10) == 0) CRODLMsg(""); /* break lines each 10 entries */
        }

        CRODLMsg("");
    }
    /* MbxGetODLTfer done */
    pMbxGetODLTfer->eTferStatus = eMbxTferStatus_Idle;

    /* Get OD List Type: TX PDO Map */
    pMbxGetODLTfer->dwClntId    = dwClientId;
    pMbxGetODLTfer->dwTferId    = dwUniqueTransferId++;
    pMbxGetODLTfer->dwDataLen   = pMbxGetODLTfer->MbxTferDesc.dwMaxDataLen;

    dwRes = emCoeGetODList(dwInstanceID, pMbxGetODLTfer, dwNodeId, eODListType_TxPdoMap, dwTimeout);
    if (EC_E_SLAVE_NOT_PRESENT == dwRes)
    {
        dwRetVal = dwRes;
        goto Exit;
    }

    /* wait until transfer object is available incl. logging error */
    HandleMbxTferReqError(poLog, (EC_T_CHAR*)"CoeReadObjectDictionary: Error in emCoeGetODList(TxPdoMap)", dwRes, pMbxGetODLTfer);
    if (EC_E_NOERROR != dwRes)
    {
        dwRetVal = dwRes;
        goto Exit;
    }

    /* now display Entries of ODList */
    if (nVerbosePrinting > 1)
    {
        CRODLMsg( "TX PDO Mappable Objects:" );
        /* iterate through all entries in list */
        for( wIndex = 0; wIndex < (pMbxGetODLTfer->MbxData.CoE_ODList.wLen); wIndex++ )
        {
            CRODLMsgAdd("%04X ", pMbxGetODLTfer->MbxData.CoE_ODList.pwOdList[wIndex]);

            if( ((wIndex+1) % 10) == 0) CRODLMsg(""); /* break lines each 10 entries */
        }

        CRODLMsg("");
    }
    /* MbxGetODLTfer done */
    pMbxGetODLTfer->eTferStatus = eMbxTferStatus_Idle;

    /* now iterate through Index list, to get closer info, sub indexes and values */

    /* get object description for all objects */
    if (nVerbosePrinting > 1)
    {
        CRODLMsg("");
        CRODLMsg("*************************************************************");
        CRODLMsg("****                  OBJECT DESCRIPTION                 ****");
        CRODLMsg("*************************************************************");
    }

    /* init value info type */
    byValueInfoType = EC_COE_ENTRY_ObjAccess
                    | EC_COE_ENTRY_ObjCategory
                    | EC_COE_ENTRY_PdoMapping
                    | EC_COE_ENTRY_UnitType
                    | EC_COE_ENTRY_DefaultValue
                    | EC_COE_ENTRY_MinValue
                    | EC_COE_ENTRY_MaxValue;

    /* now dwRetVal is used to recognize loop break condition on error, so set it to OK here */
    dwRetVal = EC_E_NOERROR;
    for (wIndex = 0; (wIndex < wODListLen) && (EC_E_NOERROR == dwRetVal) && !*pbStopReading; wIndex++)
    {
        EC_T_WORD   wSubIndexLimit  = 0xffff; /* must be greater 8 bit because wSubIndexLimit can go to 0x100 if subindex is 0xff */
        EC_T_WORD   wSubIndex       = 0;

        /* get Object Description */
        pMbxGetObDescTfer->dwClntId     = dwClientId;
        pMbxGetObDescTfer->dwDataLen    = pMbxGetObDescTfer->MbxTferDesc.dwMaxDataLen;
        pMbxGetObDescTfer->dwTferId     = dwUniqueTransferId++;

        /* get object description */
        dwRes = emCoeGetObjectDesc(dwInstanceID, pMbxGetObDescTfer, dwNodeId, pwODList[wIndex], dwTimeout);
        if (EC_E_SLAVE_NOT_PRESENT == dwRes)
        {
            dwRetVal = dwRes;
            goto Exit;
        }

        /* wait until transfer object is available incl. logging error */
        HandleMbxTferReqError(poLog, (EC_T_CHAR*)"CoeReadObjectDictionary: Error in emCoeGetObjectDesc", dwRes, pMbxGetODLTfer);
        if (EC_E_NOERROR != dwRes)
        {
            dwRetVal = dwRes;
            goto Exit;
        }

        /* display ObjectDesc */
        if (nVerbosePrinting > 1)
        {
            EC_T_WORD   wNameLen                    = 0;
            EC_T_CHAR   szObName[MAX_OBNAME_LEN]    = {0};

            wNameLen = pMbxGetObDescTfer->MbxData.CoE_ObDesc.wObNameLen;
            wNameLen = (EC_T_WORD)EC_MIN(wNameLen, MAX_OBNAME_LEN - 1);

            OsStrncpy(szObName, pMbxGetObDescTfer->MbxData.CoE_ObDesc.pchObName, (EC_T_INT)wNameLen);
            szObName[wNameLen] = '\0';

            CRODLMsg( "%04x %s: type 0x%04x, code=0x%02x, %s, SubIds=%d",
                pMbxGetObDescTfer->MbxData.CoE_ObDesc.wObIndex,
                szObName,
                pMbxGetObDescTfer->MbxData.CoE_ObDesc.wDataType,
                pMbxGetObDescTfer->MbxData.CoE_ObDesc.byObjCode,
                ((pMbxGetObDescTfer->MbxData.CoE_ObDesc.byObjCategory==0)?"optional":"mandatory"),
                pMbxGetObDescTfer->MbxData.CoE_ObDesc.byMaxNumSubIndex
                  );

            /* give logging task a chance to flush */
            if (bReadingMasterOD)
                OsSleep(2);
        }

        /* if Object is Single Variable, only subindex 0 is defined */
        if (OBJCODE_VAR == pMbxGetObDescTfer->MbxData.CoE_ObDesc.byObjCode)
        {
            wSubIndexLimit = 1;
        }
        else
        {
            wSubIndexLimit = 0xffff;
        }

        /* iterate through sub-indexes */
        for (wSubIndex = 0; (wSubIndex < wSubIndexLimit) && (EC_E_NOERROR == dwRetVal); wSubIndex++)
        {
            /* Get Entry Description */
            pMbxGetEntryDescTfer->dwClntId     = dwClientId;
            pMbxGetEntryDescTfer->dwDataLen    = pMbxGetEntryDescTfer->MbxTferDesc.dwMaxDataLen;
            pMbxGetEntryDescTfer->dwTferId     = dwUniqueTransferId++;

            dwRes = emCoeGetEntryDesc(
                dwInstanceID, pMbxGetEntryDescTfer, dwNodeId, pwODList[wIndex], EC_LOBYTE(wSubIndex), byValueInfoType, dwTimeout
                                     );
            if (EC_E_SLAVE_NOT_PRESENT == dwRes)
            {
                dwRetVal = dwRes;
                goto Exit;
            }

            /* break after last index */
            if ((EC_E_INVALIDDATA == dwRes)
             || (EC_E_SDO_ABORTCODE_OFFSET == dwRes))
            {
                break;
            }

            /* handle MBX Tfer errors and wait until tfer object is available */
            HandleMbxTferReqError( poLog, (EC_T_CHAR*)"CoeReadObjectDictionary: Error in emCoeGetEntryDesc", dwRes, pMbxGetEntryDescTfer );
            if (EC_E_NOERROR != dwRes)
            {
                dwRetVal = dwRes;
                goto Exit;
            }

            /* display EntryDesc */
            if (nVerbosePrinting > 1)
            {
                EC_T_CHAR   szAccess[50]        = {0};
                EC_T_INT    nAccessIdx          = 0;
                EC_T_CHAR   szPdoMapInfo[50]    = {0};
                EC_T_INT    nDataIdx            = 0;
                EC_T_CHAR   szUnitType[10]      = {0};
                EC_T_CHAR   szDefaultValue[10]  = {0};
                EC_T_CHAR   szMinValue[10]      = {0};
                EC_T_CHAR   szMaxValue[10]      = {0};
                EC_T_CHAR   szDescription[50]   = {0};

                EC_T_DWORD  dwUnitType          = 0;
                EC_T_BYTE*  pbyDefaultValue     = EC_NULL;
                EC_T_BYTE*  pbyMinValue         = EC_NULL;
                EC_T_BYTE*  pbyMaxValue         = EC_NULL;

                OsMemset(szAccess, 0, sizeof(szAccess));
                OsMemset(szPdoMapInfo, 0, sizeof(szPdoMapInfo));
                OsMemset(szUnitType, 0, sizeof(szUnitType));
                OsMemset(szDefaultValue, 0, sizeof(szDefaultValue));
                OsMemset(szMinValue, 0, sizeof(szMinValue));
                OsMemset(szMaxValue, 0, sizeof(szMaxValue));
                OsMemset(szDescription, 0, sizeof(szDescription));

                /* build Access Right String */
                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byObAccess & EC_COE_ENTRY_Access_R_PREOP)
                    szAccess[nAccessIdx++] = 'R';
                else
                    szAccess[nAccessIdx++] = ' ';
                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byObAccess & EC_COE_ENTRY_Access_W_PREOP)
                    szAccess[nAccessIdx++] = 'W';
                else
                    szAccess[nAccessIdx++] = ' ';

                szAccess[nAccessIdx++] = '.';

                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byObAccess & EC_COE_ENTRY_Access_R_SAFEOP)
                    szAccess[nAccessIdx++] = 'R';
                else
                    szAccess[nAccessIdx++] = ' ';
                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byObAccess & EC_COE_ENTRY_Access_W_SAFEOP)
                    szAccess[nAccessIdx++] = 'W';
                else
                    szAccess[nAccessIdx++] = ' ';

                szAccess[nAccessIdx++] = '.';

                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byObAccess & EC_COE_ENTRY_Access_R_OP)
                    szAccess[nAccessIdx++] = 'R';
                else
                    szAccess[nAccessIdx++] = ' ';
                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byObAccess & EC_COE_ENTRY_Access_W_OP)
                    szAccess[nAccessIdx++] = 'W';
                else
                    szAccess[nAccessIdx++] = ' ';

                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.bRxPdoMapping)
                {
                    OsStrncpy(szPdoMapInfo, "-RxPDO", sizeof(szPdoMapInfo) - 1);
                    if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.bTxPdoMapping)
                    {
                        OsStrncpy(&(szPdoMapInfo[OsStrlen(szPdoMapInfo)]), "+TxPDO", sizeof(szPdoMapInfo) - OsStrlen(szPdoMapInfo) - 1);
                    }
                }

                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byValueInfo & EC_COE_ENTRY_UnitType)
                {
                    dwUnitType = EC_GET_FRM_DWORD(pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.pbyData);
                    OsSnprintf(szUnitType, sizeof(szUnitType) - 1, ", UnitType 0x%08X", dwUnitType);
                    nDataIdx += 4;
                }

                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byValueInfo & EC_COE_ENTRY_DefaultValue)
                {
                    OsStrncpy(szDefaultValue, ", Default", sizeof(szDefaultValue) - 1);
                    pbyDefaultValue = &pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.pbyData[nDataIdx];
                    nDataIdx += BIT2BYTE(pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wBitLen);
                }

                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byValueInfo & EC_COE_ENTRY_MinValue)
                {
                    OsStrncpy(szMinValue, ", Min", sizeof(szMinValue) - 1);
                    pbyMinValue = &pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.pbyData[nDataIdx];
                    nDataIdx += BIT2BYTE(pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wBitLen);
                }

                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byValueInfo & EC_COE_ENTRY_MaxValue)
                {
                    OsStrncpy(szMaxValue, ", Max", sizeof(szMaxValue) - 1);
                    pbyMaxValue = &pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.pbyData[nDataIdx];
                    nDataIdx += BIT2BYTE(pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wBitLen);
                }

                if (nDataIdx + 1 <= pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wDataLen)
                {
                    OsSnprintf(szDescription, EC_MIN((EC_T_INT)(pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wDataLen - nDataIdx + 1), (EC_T_INT)(sizeof(szDescription) - 1)),
                        "%s", &pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.pbyData[nDataIdx]);
                }

                CRODLMsg( "%04x:%d %s: type=0x%04x, len=%02d, %s%s%s",
                    pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wObIndex,
                    pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byObSubIndex,
                    szDescription,
                    pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wDataType,
                    pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wBitLen,
                    szAccess, szPdoMapInfo, szUnitType, szDefaultValue, szMinValue, szMaxValue
                    );

                EC_UNREFPARM(pbyDefaultValue);
                EC_UNREFPARM(pbyMinValue);
                EC_UNREFPARM(pbyMaxValue);

                /* give logging task a chance to flush */
                if (bReadingMasterOD)
                    OsSleep(2);
            } /* display EntryDesc */

            if (0 == pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wDataType)
            {
                /* unknown datatype */
                continue;
            }

            /* SDO Upload */
            if (bPerformUpload)
            {
                EC_T_BYTE   abySDOValue[CROD_MAXSISDO_SIZE] = {0};
                EC_T_DWORD  dwUploadBytes                   = 0;

                /* get object's value */
                dwRes = emCoeSdoUpload(
                    dwInstanceID, dwNodeId, pwODList[wIndex], EC_LOBYTE(wSubIndex),
                    abySDOValue, EC_MIN( (EC_T_DWORD)(sizeof(abySDOValue)), (EC_T_DWORD)(((pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wBitLen)+7)/8) ),
                    &dwUploadBytes, dwTimeout, 0
                                      );
                if (EC_E_SLAVE_NOT_PRESENT == dwRes)
                {
                    dwRetVal = dwRes;
                    goto Exit;
                }
                else if (EC_E_NOERROR != dwRes)
                {
                    /* Upload error */
                    CRODLError("CoeReadObjectDictionary: Error in ecatCoeSdoUpload: %s (0x%lx)", ecatGetText(dwRes), dwRes);
                    dwRetVal = dwRes;
                    continue;
                }

                if (((OBJCODE_REC == pMbxGetObDescTfer->MbxData.CoE_ObDesc.byObjCode) && (0 == wSubIndex))
                 || ((OBJCODE_ARR == pMbxGetObDescTfer->MbxData.CoE_ObDesc.byObjCode) && (0 == wSubIndex)))
                {
                    wSubIndexLimit = (EC_T_BYTE)(((EC_T_WORD) abySDOValue[0]) + 1);
                }

                if (nVerbosePrinting > 1)
                {
                    switch (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wDataType)
                    {
                    case DEFTYPE_BOOLEAN:
                    case DEFTYPE_BIT1:
                    case DEFTYPE_BIT2:
                    case DEFTYPE_BIT3:
                    case DEFTYPE_BIT4:
                    case DEFTYPE_BIT5:
                    case DEFTYPE_BIT6:
                    case DEFTYPE_BIT7:
                    case DEFTYPE_BIT8:
                    case DEFTYPE_INTEGER8:
                    case DEFTYPE_UNSIGNED8:
                        {
                            CRODLMsg("%04x:%d BYTE: 0x%02X",
                                pwODList[wIndex], EC_LOBYTE(wSubIndex), abySDOValue[0]
                                  );
                        } break;
                    case DEFTYPE_INTEGER16:
                        {
                            CRODLMsg("%04x:%d SI16: %04d",
                                pwODList[wIndex], EC_LOBYTE(wSubIndex), EC_NTOHS(EC_GETWORD(&abySDOValue[0]))
                                );
                        } break;
                    case DEFTYPE_UNSIGNED16:
                        {
                            CRODLMsg("%04x:%d WORD: 0x%04X",
                                pwODList[wIndex], EC_LOBYTE(wSubIndex), EC_NTOHS(EC_GETWORD(&abySDOValue[0]))
                                  );
                        } break;
                    case DEFTYPE_INTEGER32:
                        {
                            CRODLMsg("%04x:%d SI32: %08ld",
                                pwODList[wIndex], EC_LOBYTE(wSubIndex), EC_NTOHL(EC_GETDWORD(&abySDOValue[0]))
                                );
                        } break;
                    case DEFTYPE_UNSIGNED32:
                        {
                            CRODLMsg("%04x:%d DWRD: 0x%08lX",
                                pwODList[wIndex], EC_LOBYTE(wSubIndex), EC_NTOHL(EC_GETDWORD(&abySDOValue[0]))
                                  );
                        } break;
                    case DEFTYPE_VISIBLESTRING:
                        {
                            CRODLMsg("%04x:%d STRG: %s",
                                pwODList[wIndex], EC_LOBYTE(wSubIndex), (EC_T_CHAR*)abySDOValue
                                  );
                        } break;
                    case DEFTYPE_OCTETSTRING:
                        {
#if (defined INCLUDE_MASTER_OBD)
                            if( (COEOBJID_HISTORY_OBJECT == (pwODList[wIndex])) && EC_LOBYTE(wSubIndex) > 5 )
                            {
                                /* Diag Entry */
                                EC_T_OBJ10F3_DIAGMSG*   pDiag = (EC_T_OBJ10F3_DIAGMSG*)abySDOValue;
                                CRODLMsg("%04x:%d DIAG # 0x%lx type <%s> Text 0x%x Time: 0x%x.%x",
                                    pwODList[wIndex], EC_LOBYTE(wSubIndex),
                                    pDiag->dwDiagNumber,
                                    (((pDiag->wFlags&0x0F)==DIAGFLAGERROR)?"ERR":(((pDiag->wFlags&0x0F)==DIAGFLAGWARN)?"WARN":(((pDiag->wFlags&0x0F)==DIAGFLAGINFO)?"INF":"UNK"))),
                                    pDiag->wTextId,
#ifdef  __TMS470__
                                    pDiag->dwTimeStampHi, pDiag->dwTimeStampLo
#else
                                    EC_HIDWORD(pDiag->qwTimeStamp), EC_LODWORD(pDiag->qwTimeStamp)
#endif
                                      );
                                ParseDiagMsg(poLog, pDiag);
                            }
                            else
#endif
                            {
                                CRODLMsg("%04x:%d OCTS: %s",
                                    pwODList[wIndex], EC_LOBYTE(wSubIndex), (EC_T_CHAR*)abySDOValue
                                    );
                            }
                        } break;
                    case DEFTYPE_UNSIGNED48:
                        {
                            CRODLMsg("%04x:%d US48: %02X:%02X:%02X:%02X:%02X:%02X",
                                pwODList[wIndex], EC_LOBYTE(wSubIndex),
                                abySDOValue[0],
                                abySDOValue[1],
                                abySDOValue[2],
                                abySDOValue[3],
                                abySDOValue[4],
                                abySDOValue[5]
                                    );
                        } break;
                    case DEFTYPE_UNSIGNED64:
                        {
                            CRODLMsg("%04x:%d QWRD: 0x%08lX.%08lX",
                                pwODList[wIndex], EC_LOBYTE(wSubIndex),
                                EC_HIDWORD(EC_NTOHLL(EC_GETQWORD(&abySDOValue[0]))),
                                EC_LODWORD(EC_NTOHLL(EC_GETQWORD(&abySDOValue[0])))
                                  );
                        } break;
                    default:
                        {
                            EC_T_DWORD  dwIdx = 0;

                            CRODLMsg("%04x:%d DFLT: ", pwODList[wIndex], EC_LOBYTE(wSubIndex));
                            for (dwIdx = 0; dwIdx < dwUploadBytes; dwIdx++)
                            {
                                CRODLMsgAdd("%02x ", abySDOValue[dwIdx]);
                                if ((0 != dwIdx) && (0 == (dwIdx%8)))
                                {
                                    CRODLMsgAdd(" ");
                                }
                                if ((0 != dwIdx) && (0 == (dwIdx%32)))
                                {
                                    CRODLMsgAdd("\n");
                                }
                            }
                            CRODLMsg("");
                        } break;
                    } /* switch (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wDataType) */

#if (defined INCLUDE_MASTER_OBD)
                    if (COEOBJID_SLAVECFGINFOBASE <= pwODList[wIndex] && 1 == EC_LOBYTE(wSubIndex))
                    {
                        EC_T_BOOL bEntryValid   = EC_FALSE;
                        bEntryValid = EC_NTOHL(EC_GETDWORD(abySDOValue));

                        /* do not show unused Slave Entries */
                        if (!bEntryValid)
                        {
                            break;
                        }
                    }
#endif
                    /* give logging task a chance to flush */
                    if (bReadingMasterOD)
                        OsSleep(2);
                } /* nVerbosePrinting > 1 */
            } /* bPerformUpload */

            /* MbxGetObDescTfer done */
            pMbxGetObDescTfer->eTferStatus = eMbxTferStatus_Idle;
        } /* for (wSubIndex = 0; (wSubIndex < wSubIndexLimit) && (EC_E_NOERROR == dwRetVal); wSubIndex++) */
    } /* for (wIndex = 0; (wIndex < wODListLen) && (EC_E_NOERROR == dwRetVal) && !*pbStopReading; wIndex++) */

    dwRetVal = EC_E_NOERROR;
Exit:
    /* Delete MBX Transfer objects */
    if (EC_NULL != pMbxGetODLTfer)
    {
        emMbxTferDelete(dwInstanceID, pMbxGetODLTfer);
        pMbxGetODLTfer = EC_NULL;
    }
    if (EC_NULL != pMbxGetObDescTfer)
    {
        emMbxTferDelete(dwInstanceID, pMbxGetObDescTfer);
        pMbxGetObDescTfer = EC_NULL;
    }
    if (EC_NULL != pMbxGetEntryDescTfer)
    {
        emMbxTferDelete(dwInstanceID, pMbxGetEntryDescTfer);
        pMbxGetEntryDescTfer = EC_NULL;
    }

    /* Free allocated memory */
    SafeOsFree(pwODList);
    SafeOsFree(pbyODLTferBuffer);
    SafeOsFree(pbyOBDescTferBuffer);
    SafeOsFree(pbyGetEntryTferBuffer);

    return dwRetVal;
}